

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

void __thiscall
vkt::rasterization::anon_unknown_0::BaseRenderingTestInstance::BaseRenderingTestInstance
          (BaseRenderingTestInstance *this,Context *context,VkSampleCountFlagBits sampleCount,
          deUint32 renderSize)

{
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar2;
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar3;
  Move<vk::Handle<(vk::HandleType)13>_> *__s;
  Move<vk::Handle<(vk::HandleType)21>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar5;
  Move<vk::Handle<(vk::HandleType)19>_> *pMVar6;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar7;
  Move<vk::Handle<(vk::HandleType)16>_> *__s_00;
  Move<vk::Handle<(vk::HandleType)8>_> *pMVar8;
  deUint32 *pdVar9;
  void **ppvVar10;
  VkCommandPool obj;
  VkImage VVar11;
  Allocation *pAVar12;
  deUint64 dVar13;
  VkImageView VVar14;
  VkRenderPass obj_00;
  VkFramebuffer obj_01;
  VkBuffer VVar15;
  VkDescriptorPool obj_02;
  VkDescriptorSetLayout obj_03;
  DeviceInterface *pDVar16;
  VkPipelineLayout obj_04;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var17;
  VkShaderModule VVar18;
  VkFence obj_05;
  undefined8 uVar19;
  VkDevice pVVar20;
  VkAllocationCallbacks *pVVar21;
  int iVar22;
  VkResult VVar23;
  VkPhysicalDeviceProperties *pVVar24;
  TextureFormat TVar25;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *pAVar26;
  InstanceInterface *pIVar27;
  VkPhysicalDevice pVVar28;
  const_iterator cVar29;
  NotSupportedError *pNVar30;
  bool bVar31;
  deUint32 queueFamilyIndex;
  VkSubpassDescription subpassDesc;
  VkImageFormatProperties properties;
  VkImageView attachments [2];
  VkAttachmentReference *local_2d8;
  VkAllocationCallbacks *pVStack_2d0;
  DescriptorPoolBuilder descriptorPoolBuilder;
  Move<vk::Handle<(vk::HandleType)17>_> local_238;
  Move<vk::Handle<(vk::HandleType)9>_> *local_218;
  Move<vk::Handle<(vk::HandleType)24>_> *local_210;
  VkImageCreateInfo imageCreateInfo;
  ios_base local_190 [264];
  DescriptorSetLayoutBuilder descriptorSetLayoutBuilder;
  VkAttachmentReference resolveAttachmentRef;
  VkAttachmentReference attachmentRef;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__BaseRenderingTestInstance_00d65128;
  this->m_renderSize = renderSize;
  this->m_sampleCount = sampleCount;
  pVVar24 = Context::getDeviceProperties(context);
  this->m_subpixelBits = (pVVar24->limits).subPixelPrecisionBits;
  this->m_multisampling = (uint)(this->m_sampleCount != VK_SAMPLE_COUNT_1_BIT);
  this->m_imageFormat = VK_FORMAT_R8G8B8A8_UNORM;
  TVar25 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  this->m_textureFormat = TVar25;
  pMVar1 = &this->m_commandPool;
  pMVar2 = &this->m_image;
  pMVar3 = &this->m_resolvedImage;
  __s = &this->m_resolvedImageView;
  pMVar4 = &this->m_descriptorPool;
  pMVar5 = &this->m_descriptorSet;
  pMVar6 = &this->m_descriptorSetLayout;
  pMVar7 = &this->m_uniformBuffer;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_imageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
  .ptr = (Allocation *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal = 0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolvedImageMemory).
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  memset(__s,0,0xe8);
  this->m_uniformBufferSize = 4;
  __s_00 = &this->m_pipelineLayout;
  pMVar8 = &this->m_resultBuffer;
  memset(__s_00,0,0xa8);
  local_218 = pMVar2;
  local_210 = pMVar1;
  iVar22 = tcu::TextureFormat::getPixelSize(&this->m_textureFormat);
  this->m_resultBufferSize = (ulong)(renderSize * renderSize * iVar22);
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pAVar26 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&descriptorPoolBuilder);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&descriptorSetLayoutBuilder);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
  imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
  imageCreateInfo.format = subpassDesc.colorAttachmentCount;
  imageCreateInfo.extent.width = subpassDesc._28_4_;
  imageCreateInfo.sType = subpassDesc.flags;
  imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
  imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
  imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
  subpassDesc.flags = 0;
  subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  subpassDesc.inputAttachmentCount = 0;
  subpassDesc._12_4_ = 0;
  subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
  subpassDesc.colorAttachmentCount = 0;
  subpassDesc._28_4_ = 0;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal
  ;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj);
  }
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       imageCreateInfo._0_8_;
  (this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)
         CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
  if (subpassDesc._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&subpassDesc.inputAttachmentCount,
               (VkCommandPool)subpassDesc._0_8_);
  }
  pIVar27 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  pVVar28 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  iVar22 = (*pIVar27->_vptr_InstanceInterface[4])
                     (pIVar27,pVVar28,(ulong)this->m_imageFormat,1,0,0x11,0,&properties);
  if (iVar22 == -0xb) {
    pNVar30 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar30,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xeb);
  }
  else {
    imageCreateInfo.samples = this->m_sampleCount;
    if ((imageCreateInfo.samples & ~properties.sampleCounts) == 0) {
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.imageType = VK_IMAGE_TYPE_2D;
      imageCreateInfo.format = this->m_imageFormat;
      imageCreateInfo.extent.width = this->m_renderSize;
      imageCreateInfo.extent.depth = 1;
      imageCreateInfo.mipLevels = 1;
      imageCreateInfo.arrayLayers = 1;
      imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
      imageCreateInfo.usage = 0x11;
      imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      imageCreateInfo.queueFamilyIndexCount = 1;
      imageCreateInfo.pQueueFamilyIndices = &queueFamilyIndex;
      imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
      imageCreateInfo.extent.height = imageCreateInfo.extent.width;
      ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                        &imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = local_2d8;
      subpassDesc._24_8_ = pVStack_2d0;
      subpassDesc.flags = (undefined4)attachments[0].m_internal;
      subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
      subpassDesc._8_8_ = attachments[1].m_internal;
      attachments[0].m_internal = 0;
      attachments[1].m_internal = 0;
      VVar11.m_internal =
           (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
      if (VVar11.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  (&(this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                   VVar11);
      }
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)subpassDesc._24_8_;
      (pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)subpassDesc._8_8_;
      if (attachments[0].m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(attachments + 1),
                   (VkImage)attachments[0].m_internal);
      }
      ::vk::getImageMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkImage)(pMVar2->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                          m_internal);
      (*pAVar26->_vptr_Allocator[3])(attachments,pAVar26,&subpassDesc,0);
      VVar14 = attachments[0];
      attachments[0].m_internal = 0;
      pAVar12 = (this->m_imageMemory).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar12 != (Allocation *)VVar14.m_internal) {
        if (pAVar12 != (Allocation *)0x0) {
          (*pAVar12->_vptr_Allocation[1])();
          (this->m_imageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)0x0;
        }
        (this->m_imageMemory).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
        m_data.ptr = (Allocation *)VVar14.m_internal;
      }
      if (attachments[0].m_internal != 0) {
        (**(code **)(*(long *)attachments[0].m_internal + 8))();
        attachments[0].m_internal = 0;
      }
      VVar23 = (*vk->_vptr_DeviceInterface[0xd])
                         (vk,device,
                          (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                          object.m_internal,
                          (((this->m_imageMemory).
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data.ptr)->m_memory).m_internal);
      ::vk::checkResult(VVar23,
                        "vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x109);
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      dVar13 = (this->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
               m_internal;
      imageCreateInfo.format = (VkFormat)dVar13;
      imageCreateInfo.extent.width = (deUint32)(dVar13 >> 0x20);
      imageCreateInfo.extent.height = 1;
      imageCreateInfo.extent.depth = this->m_imageFormat;
      imageCreateInfo.mipLevels = 3;
      imageCreateInfo.arrayLayers = 4;
      imageCreateInfo.samples = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_1_BIT;
      imageCreateInfo.tiling = 6;
      imageCreateInfo.usage = 1;
      imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      imageCreateInfo.queueFamilyIndexCount = 1;
      imageCreateInfo._68_4_ = 0;
      imageCreateInfo.pQueueFamilyIndices =
           (deUint32 *)CONCAT44(imageCreateInfo.pQueueFamilyIndices._4_4_,1);
      ::vk::createImageView
                ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                 (VkImageViewCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar14.m_internal =
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      if (VVar14.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                    deleter,VVar14);
      }
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator
           = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&properties.maxExtent.depth,
                   (VkImageView)properties.maxExtent._0_8_);
      }
      if (this->m_multisampling != 0) {
        pIVar27 = Context::getInstanceInterface((this->super_TestInstance).m_context);
        pVVar28 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
        iVar22 = (*pIVar27->_vptr_InstanceInterface[4])
                           (pIVar27,pVVar28,(ulong)this->m_imageFormat,1,0,0x13,0,&properties);
        if (iVar22 == -0xb) {
          pNVar30 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar30,"Format not supported",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                     ,0x132);
          __cxa_throw(pNVar30,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        imageCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
        imageCreateInfo.pNext._0_4_ = 0;
        imageCreateInfo.pNext._4_4_ = 0;
        imageCreateInfo.flags = 0;
        imageCreateInfo.imageType = VK_IMAGE_TYPE_2D;
        imageCreateInfo.format = this->m_imageFormat;
        imageCreateInfo.extent.width = this->m_renderSize;
        imageCreateInfo.extent.depth = 1;
        imageCreateInfo.mipLevels = 1;
        imageCreateInfo.arrayLayers = 1;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
        imageCreateInfo.usage = 0x13;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.queueFamilyIndexCount = 1;
        imageCreateInfo.pQueueFamilyIndices = &queueFamilyIndex;
        imageCreateInfo.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
        imageCreateInfo.extent.height = imageCreateInfo.extent.width;
        ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)attachments,vk,device,
                          &imageCreateInfo,(VkAllocationCallbacks *)0x0);
        subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
        subpassDesc.colorAttachmentCount = 0;
        subpassDesc._28_4_ = 0;
        subpassDesc.flags = (undefined4)attachments[0].m_internal;
        subpassDesc.pipelineBindPoint = attachments[0].m_internal._4_4_;
        subpassDesc._8_8_ = attachments[1].m_internal;
        attachments[0].m_internal = 0;
        attachments[1].m_internal = 0;
        VVar11.m_internal =
             (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
        if (VVar11.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    (&(this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      deleter,VVar11);
        }
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (attachments[0].m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(attachments + 1),
                     (VkImage)attachments[0].m_internal);
        }
        ::vk::getImageMemoryRequirements
                  ((VkMemoryRequirements *)&subpassDesc,vk,device,
                   (VkImage)(pMVar3->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                            m_internal);
        (*pAVar26->_vptr_Allocator[3])(attachments,pAVar26,&subpassDesc,0);
        VVar14 = attachments[0];
        attachments[0].m_internal = 0;
        pAVar12 = (this->m_resolvedImageMemory).
                  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
        if (pAVar12 != (Allocation *)VVar14.m_internal) {
          if (pAVar12 != (Allocation *)0x0) {
            (*pAVar12->_vptr_Allocation[1])();
            (this->m_resolvedImageMemory).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
                 (Allocation *)0x0;
          }
          (this->m_resolvedImageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)VVar14.m_internal;
        }
        if (attachments[0].m_internal != 0) {
          (**(code **)(*(long *)attachments[0].m_internal + 8))();
          attachments[0].m_internal = 0;
        }
        VVar23 = (*vk->_vptr_DeviceInterface[0xd])
                           (vk,device,
                            (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                            m_data.object.m_internal,
                            (((this->m_resolvedImageMemory).
                              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                              m_data.ptr)->m_memory).m_internal);
        ::vk::checkResult(VVar23,
                          "vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset())"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                          ,0x14a);
        imageCreateInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        imageCreateInfo.pNext._0_4_ = 0;
        imageCreateInfo.pNext._4_4_ = 0;
        imageCreateInfo.flags = 0;
        dVar13 = (this->m_resolvedImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object
                 .m_internal;
        imageCreateInfo.format = (VkFormat)dVar13;
        imageCreateInfo.extent.width = (deUint32)(dVar13 >> 0x20);
        imageCreateInfo.extent.height = 1;
        imageCreateInfo.extent.depth = this->m_imageFormat;
        imageCreateInfo.mipLevels = 3;
        imageCreateInfo.arrayLayers = 4;
        imageCreateInfo.samples = VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_1_BIT;
        imageCreateInfo.tiling = 6;
        imageCreateInfo.usage = 1;
        imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
        imageCreateInfo.queueFamilyIndexCount = 1;
        imageCreateInfo._68_4_ = 0;
        imageCreateInfo.pQueueFamilyIndices =
             (deUint32 *)CONCAT44(imageCreateInfo.pQueueFamilyIndices._4_4_,1);
        ::vk::createImageView
                  ((Move<vk::Handle<(vk::HandleType)13>_> *)&properties,vk,device,
                   (VkImageViewCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
        subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
        subpassDesc._24_8_ = properties.maxResourceSize;
        subpassDesc.flags = properties.maxExtent.width;
        subpassDesc.pipelineBindPoint = properties.maxExtent.height;
        subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
        subpassDesc._12_4_ = properties.maxMipLevels;
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
        properties.maxExtent.depth = 0;
        properties.maxMipLevels = 0;
        properties.maxArrayLayers = 0;
        properties.sampleCounts = 0;
        properties.maxResourceSize = 0;
        VVar14.m_internal =
             (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
        if (VVar14.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    (&(this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.
                      m_data.deleter,VVar14);
        }
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_device = (VkDevice)subpassDesc.pInputAttachments;
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
        (__s->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
             subpassDesc._0_8_;
        (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
        if (properties.maxExtent._0_8_ != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                    ((Deleter<vk::Handle<(vk::HandleType)13>_> *)&properties.maxExtent.depth,
                     (VkImageView)properties.maxExtent._0_8_);
        }
      }
      imageCreateInfo.mipLevels = this->m_imageFormat;
      imageCreateInfo._0_8_ = (ulong)imageCreateInfo.mipLevels << 0x20;
      imageCreateInfo.pNext._0_4_ = this->m_sampleCount;
      imageCreateInfo.pNext._4_4_ = 1;
      imageCreateInfo.flags = 0;
      imageCreateInfo.imageType = VK_IMAGE_TYPE_3D;
      imageCreateInfo.format = VK_FORMAT_R4G4_UNORM_PACK8;
      imageCreateInfo.extent.width = 2;
      imageCreateInfo.extent.height = 2;
      imageCreateInfo.extent.depth = 0;
      imageCreateInfo.arrayLayers = 1;
      imageCreateInfo.samples = VK_SAMPLE_COUNT_2_BIT;
      imageCreateInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
      imageCreateInfo.usage = 2;
      imageCreateInfo.sharingMode = VK_SHARING_MODE_CONCURRENT;
      imageCreateInfo.queueFamilyIndexCount = 2;
      imageCreateInfo._68_4_ = 2;
      subpassDesc.pColorAttachments = &attachmentRef;
      attachmentRef.attachment = 0;
      attachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      resolveAttachmentRef.attachment = 1;
      resolveAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc._8_8_ = subpassDesc._8_8_ & 0xffffffff00000000;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 1;
      bVar31 = this->m_multisampling != 0;
      subpassDesc.pResolveAttachments = &resolveAttachmentRef;
      if (!bVar31) {
        subpassDesc.pResolveAttachments = (VkAttachmentReference *)0x0;
      }
      subpassDesc.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
      subpassDesc.preserveAttachmentCount = 0;
      subpassDesc.pPreserveAttachments = (deUint32 *)0x0;
      properties.maxExtent.width = 0x26;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties._16_8_ = (ulong)(bVar31 + 1) << 0x20;
      properties.maxResourceSize = (VkDeviceSize)&imageCreateInfo;
      ::vk::createRenderPass
                (&local_238,vk,device,(VkRenderPassCreateInfo *)&properties,
                 (VkAllocationCallbacks *)0x0);
      pVVar21 = local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
      pVVar20 = local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
      attachments[0].m_internal =
           local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
      attachments[1].m_internal =
           (deUint64)
           local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
      local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
      local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           (VkDevice)0x0;
      local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      obj_00.m_internal =
           (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
           m_internal;
      if (obj_00.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                    deleter,obj_00);
      }
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
           pVVar20;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
           = pVVar21;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
           attachments[0].m_internal;
      (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)attachments[1].m_internal;
      if (local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                  (&local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                   (VkRenderPass)
                   local_238.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
                  );
      }
      attachments[0].m_internal =
           (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      attachments[1].m_internal =
           (this->m_resolvedImageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
           m_internal;
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      dVar13 = (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
               m_internal;
      imageCreateInfo.format = (VkFormat)dVar13;
      imageCreateInfo.extent.width = (deUint32)(dVar13 >> 0x20);
      imageCreateInfo.extent.height = 2 - (this->m_multisampling == 0);
      imageCreateInfo._40_8_ = attachments;
      imageCreateInfo.samples = this->m_renderSize;
      imageCreateInfo.usage = 1;
      imageCreateInfo.tiling = imageCreateInfo.samples;
      ::vk::createFramebuffer
                ((Move<vk::Handle<(vk::HandleType)23>_> *)&properties,vk,device,
                 (VkFramebufferCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      obj_01.m_internal =
           (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
           m_internal;
      if (obj_01.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  (&(this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.
                    deleter,obj_01);
      }
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal
           = subpassDesc._0_8_;
      (this->m_frameBuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&properties.maxExtent.depth,
                   (VkFramebuffer)properties.maxExtent._0_8_);
      }
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.format = (VkFormat)this->m_uniformBufferSize;
      imageCreateInfo.extent.width = (deUint32)(this->m_uniformBufferSize >> 0x20);
      imageCreateInfo.extent.height = 0x10;
      imageCreateInfo.extent.depth = 0;
      imageCreateInfo.mipLevels = 1;
      imageCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar15.m_internal =
           (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      if (VVar15.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&(this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                    deleter,VVar15);
      }
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device
           = (VkDevice)subpassDesc.pInputAttachments;
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&properties.maxExtent.depth,
                   (VkBuffer)properties.maxExtent._0_8_);
      }
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar26->_vptr_Allocator[3])(&properties,pAVar26,&subpassDesc,1);
      uVar19 = properties.maxExtent._0_8_;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      pAVar12 = (this->m_uniformBufferMemory).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar12 != (Allocation *)uVar19) {
        if (pAVar12 != (Allocation *)0x0) {
          (*pAVar12->_vptr_Allocation[1])();
          (this->m_uniformBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)0x0;
        }
        (this->m_uniformBufferMemory).
        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
             (Allocation *)uVar19;
      }
      if (properties.maxExtent._0_8_ != 0) {
        (**(code **)(*(long *)properties.maxExtent._0_8_ + 8))();
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
      }
      pAVar12 = (this->m_uniformBufferMemory).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar23 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (this->m_uniformBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.object.m_internal,(pAVar12->m_memory).m_internal,pAVar12->m_offset)
      ;
      ::vk::checkResult(VVar23,
                        "vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x1d6);
      ::vk::DescriptorPoolBuilder::addType
                (&descriptorPoolBuilder,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1);
      ::vk::DescriptorPoolBuilder::build
                ((Move<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc,&descriptorPoolBuilder,vk,
                 device,1,1);
      imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
      imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
      imageCreateInfo.format = subpassDesc.colorAttachmentCount;
      imageCreateInfo.extent.width = subpassDesc._28_4_;
      imageCreateInfo.sType = subpassDesc.flags;
      imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      obj_02.m_internal =
           (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal;
      if (obj_02.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                    deleter,obj_02);
      }
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
      (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
           imageCreateInfo._0_8_;
      (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
      if (subpassDesc._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&subpassDesc.inputAttachmentCount,
                   (VkDescriptorPool)subpassDesc._0_8_);
      }
      ::vk::DescriptorSetLayoutBuilder::addBinding
                (&descriptorSetLayoutBuilder,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,1,0x7fffffff,
                 (VkSampler *)0x0);
      ::vk::DescriptorSetLayoutBuilder::build
                ((Move<vk::Handle<(vk::HandleType)19>_> *)&subpassDesc,&descriptorSetLayoutBuilder,
                 vk,device,0);
      imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
      imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
      imageCreateInfo.format = subpassDesc.colorAttachmentCount;
      imageCreateInfo.extent.width = subpassDesc._28_4_;
      imageCreateInfo.sType = subpassDesc.flags;
      imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      obj_03.m_internal =
           (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal;
      if (obj_03.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                    m_data.deleter,obj_03);
      }
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
      (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
           imageCreateInfo._0_8_;
      (this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
      if (subpassDesc._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)19>_> *)&subpassDesc.inputAttachmentCount,
                   (VkDescriptorSetLayout)subpassDesc._0_8_);
      }
      subpassDesc.flags = 0x22;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments =
           (VkAttachmentReference *)
           (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal;
      subpassDesc.colorAttachmentCount = 1;
      subpassDesc.pColorAttachments = (VkAttachmentReference *)pMVar6;
      ::vk::allocateDescriptorSet
                ((Move<vk::Handle<(vk::HandleType)22>_> *)&properties,vk,device,
                 (VkDescriptorSetAllocateInfo *)&subpassDesc);
      imageCreateInfo.flags = properties.maxArrayLayers;
      imageCreateInfo.imageType = properties.sampleCounts;
      imageCreateInfo.format = (VkFormat)properties.maxResourceSize;
      imageCreateInfo.extent.width = properties.maxResourceSize._4_4_;
      imageCreateInfo.sType = properties.maxExtent.width;
      imageCreateInfo._4_4_ = properties.maxExtent.height;
      imageCreateInfo.pNext._0_4_ = properties.maxExtent.depth;
      imageCreateInfo.pNext._4_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      dVar13 = (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal;
      if (dVar13 != 0) {
        pDVar16 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                  deleter.m_deviceIface;
        attachments[0].m_internal = dVar13;
        (*pDVar16->_vptr_DeviceInterface[0x3d])
                  (pDVar16,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.
                           m_data.deleter.m_device,
                   (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                   deleter.m_pool.m_internal,1);
      }
      *(VkImageCreateFlags *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_device = imageCreateInfo.flags;
      *(VkImageType *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_device + 4) = imageCreateInfo.imageType;
      *(VkFormat *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
        .m_internal = imageCreateInfo.format;
      *(deUint32 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal + 4) = imageCreateInfo.extent.width;
      *(VkStructureType *)
       &(pMVar5->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
           imageCreateInfo.sType;
      *(undefined4 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
               m_internal + 4) = imageCreateInfo._4_4_;
      *(VkSampleCountFlagBits *)
       &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
        m_deviceIface = (VkSampleCountFlagBits)imageCreateInfo.pNext;
      *(deUint32 *)
       ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_deviceIface + 4) = imageCreateInfo.pNext._4_4_;
      if (properties.maxExtent._0_8_ != 0) {
        imageCreateInfo.sType = properties.maxExtent.width;
        imageCreateInfo._4_4_ = properties.maxExtent.height;
        (**(code **)(*(long *)properties._8_8_ + 0x1e8))
                  (properties._8_8_,properties._16_8_,properties.maxResourceSize,1);
      }
      properties.maxExtent._0_8_ =
           (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0xffffffff;
      properties.sampleCounts = 0xffffffff;
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      dVar13 = (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal;
      imageCreateInfo.flags = (VkImageCreateFlags)dVar13;
      imageCreateInfo.imageType = (VkImageType)(dVar13 >> 0x20);
      imageCreateInfo.format = VK_FORMAT_UNDEFINED;
      imageCreateInfo.extent.width = 0;
      imageCreateInfo.extent.height = 1;
      imageCreateInfo.extent.depth = 6;
      imageCreateInfo.mipLevels = 0;
      imageCreateInfo.arrayLayers = 0;
      imageCreateInfo.usage = 0;
      imageCreateInfo.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
      imageCreateInfo._48_8_ = &properties;
      (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,&imageCreateInfo,0,0);
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.imageType = VK_IMAGE_TYPE_2D;
      imageCreateInfo.extent.height = 0;
      imageCreateInfo.mipLevels = 0;
      imageCreateInfo.arrayLayers = 0;
      imageCreateInfo._24_8_ = pMVar6;
      ::vk::createPipelineLayout
                ((Move<vk::Handle<(vk::HandleType)16>_> *)&properties,vk,device,
                 (VkPipelineLayoutCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      obj_04.m_internal =
           (__s_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal;
      if (obj_04.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                    deleter,obj_04);
      }
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
      m_device = (VkDevice)subpassDesc.pInputAttachments;
      (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      *(VkSubpassDescriptionFlags *)
       &(__s_00->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
           subpassDesc.flags;
      *(VkPipelineBindPoint *)
       ((long)&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object
               .m_internal + 4) = subpassDesc.pipelineBindPoint;
      *(deUint32 *)
       &(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
        m_deviceIface = subpassDesc.inputAttachmentCount;
      *(undefined4 *)
       ((long)&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
               deleter.m_deviceIface + 4) = subpassDesc._12_4_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&properties.maxExtent.depth,
                   (VkPipelineLayout)properties.maxExtent._0_8_);
      }
      p_Var17 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 *)((this->super_TestInstance).m_context)->m_progCollection;
      pdVar9 = &properties.maxArrayLayers;
      properties.maxExtent._0_8_ = pdVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"vertext_shader","");
      cVar29 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(p_Var17,(key_type *)&properties);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc,vk,device,
                 *(ProgramBinary **)(cVar29._M_node + 2),0);
      imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
      imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
      imageCreateInfo.format = subpassDesc.colorAttachmentCount;
      imageCreateInfo.extent.width = subpassDesc._28_4_;
      imageCreateInfo.sType = subpassDesc.flags;
      imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      VVar18.m_internal =
           (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object
           .m_internal;
      if (VVar18.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&(this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter,VVar18);
      }
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
      m_internal = imageCreateInfo._0_8_;
      (this->m_vertexShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
      if (subpassDesc._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc.inputAttachmentCount,
                   (VkShaderModule)subpassDesc._0_8_);
      }
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      if ((deUint32 *)properties.maxExtent._0_8_ != pdVar9) {
        operator_delete((void *)properties.maxExtent._0_8_,properties._16_8_ + 1);
      }
      p_Var17 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                 *)((this->super_TestInstance).m_context)->m_progCollection;
      properties.maxExtent._0_8_ = pdVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"fragment_shader","");
      cVar29 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
               ::find(p_Var17,(key_type *)&properties);
      ::vk::createShaderModule
                ((Move<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc,vk,device,
                 *(ProgramBinary **)(cVar29._M_node + 2),0);
      imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
      imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
      imageCreateInfo.format = subpassDesc.colorAttachmentCount;
      imageCreateInfo.extent.width = subpassDesc._28_4_;
      imageCreateInfo.sType = subpassDesc.flags;
      imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      VVar18.m_internal =
           (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
           object.m_internal;
      if (VVar18.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  (&(this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                    m_data.deleter,VVar18);
      }
      (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_device = (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
      (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)
                    CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
      (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
      m_internal = imageCreateInfo._0_8_;
      (this->m_fragmentShaderModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
      m_deviceIface =
           (DeviceInterface *)
           CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
      if (subpassDesc._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&subpassDesc.inputAttachmentCount,
                   (VkShaderModule)subpassDesc._0_8_);
      }
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      if ((deUint32 *)properties.maxExtent._0_8_ != pdVar9) {
        operator_delete((void *)properties.maxExtent._0_8_,properties._16_8_ + 1);
      }
      ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc,vk,device,0,
                        (VkAllocationCallbacks *)0x0);
      imageCreateInfo.flags = (VkImageCreateFlags)subpassDesc.pInputAttachments;
      imageCreateInfo.imageType = (VkImageType)((ulong)subpassDesc.pInputAttachments >> 0x20);
      imageCreateInfo.format = subpassDesc.colorAttachmentCount;
      imageCreateInfo.extent.width = subpassDesc._28_4_;
      imageCreateInfo.sType = subpassDesc.flags;
      imageCreateInfo._4_4_ = subpassDesc.pipelineBindPoint;
      imageCreateInfo.pNext._0_4_ = subpassDesc.inputAttachmentCount;
      imageCreateInfo.pNext._4_4_ = subpassDesc._12_4_;
      subpassDesc.flags = 0;
      subpassDesc.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
      subpassDesc.inputAttachmentCount = 0;
      subpassDesc._12_4_ = 0;
      subpassDesc.pInputAttachments = (VkAttachmentReference *)0x0;
      subpassDesc.colorAttachmentCount = 0;
      subpassDesc._28_4_ = 0;
      obj_05.m_internal =
           (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
      if (obj_05.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                   obj_05);
      }
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
           (VkDevice)CONCAT44(imageCreateInfo.imageType,imageCreateInfo.flags);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)CONCAT44(imageCreateInfo.extent.width,imageCreateInfo.format);
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
           imageCreateInfo._0_8_;
      (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)
           CONCAT44(imageCreateInfo.pNext._4_4_,(VkSampleCountFlagBits)imageCreateInfo.pNext);
      if (subpassDesc._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&subpassDesc.inputAttachmentCount,
                   (VkFence)subpassDesc._0_8_);
      }
      imageCreateInfo.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
      imageCreateInfo.pNext._0_4_ = 0;
      imageCreateInfo.pNext._4_4_ = 0;
      imageCreateInfo.flags = 0;
      imageCreateInfo.format = (VkFormat)this->m_resultBufferSize;
      imageCreateInfo.extent.width = (deUint32)(this->m_resultBufferSize >> 0x20);
      imageCreateInfo.extent.height = 2;
      imageCreateInfo.extent.depth = 0;
      imageCreateInfo.mipLevels = 1;
      imageCreateInfo._48_8_ = &queueFamilyIndex;
      ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,vk,device,
                         (VkBufferCreateInfo *)&imageCreateInfo,(VkAllocationCallbacks *)0x0);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc._24_8_ = properties.maxResourceSize;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      properties.maxExtent.depth = 0;
      properties.maxMipLevels = 0;
      properties.maxArrayLayers = 0;
      properties.sampleCounts = 0;
      properties.maxResourceSize = 0;
      VVar15.m_internal =
           (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal;
      if (VVar15.m_internal != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  (&(this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                    deleter,VVar15);
      }
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
           (VkDevice)subpassDesc.pInputAttachments;
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)subpassDesc._24_8_;
      (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal =
           subpassDesc._0_8_;
      (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
      m_deviceIface = (DeviceInterface *)subpassDesc._8_8_;
      if (properties.maxExtent._0_8_ != 0) {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                  ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&properties.maxExtent.depth,
                   (VkBuffer)properties.maxExtent._0_8_);
      }
      ::vk::getBufferMemoryRequirements
                ((VkMemoryRequirements *)&subpassDesc,vk,device,
                 (VkBuffer)
                 (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)8>_>).m_data.object.m_internal);
      (*pAVar26->_vptr_Allocator[3])(&properties,pAVar26,&subpassDesc,1);
      uVar19 = properties.maxExtent._0_8_;
      properties.maxExtent.width = 0;
      properties.maxExtent.height = 0;
      pAVar12 = (this->m_resultBufferMemory).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (pAVar12 != (Allocation *)uVar19) {
        if (pAVar12 != (Allocation *)0x0) {
          (*pAVar12->_vptr_Allocation[1])();
          (this->m_resultBufferMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)0x0;
        }
        (this->m_resultBufferMemory).
        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
             (Allocation *)uVar19;
      }
      if (properties.maxExtent._0_8_ != 0) {
        (**(code **)(*(long *)properties.maxExtent._0_8_ + 8))();
        properties.maxExtent.width = 0;
        properties.maxExtent.height = 0;
      }
      pAVar12 = (this->m_resultBufferMemory).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      VVar23 = (*vk->_vptr_DeviceInterface[0xc])
                         (vk,device,
                          (this->m_resultBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                          m_data.object.m_internal,(pAVar12->m_memory).m_internal,pAVar12->m_offset)
      ;
      ::vk::checkResult(VVar23,
                        "vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
                        ,0x22e);
      imageCreateInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      ppvVar10 = &imageCreateInfo.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppvVar10,"Sample count = ",0xf);
      ::vk::getSampleCountFlagsStr((Bitfield<32UL> *)&properties,this->m_sampleCount);
      subpassDesc.pInputAttachments = (VkAttachmentReference *)properties._16_8_;
      subpassDesc.flags = properties.maxExtent.width;
      subpassDesc.pipelineBindPoint = properties.maxExtent.height;
      subpassDesc.inputAttachmentCount = properties.maxExtent.depth;
      subpassDesc._12_4_ = properties.maxMipLevels;
      tcu::Format::Bitfield<32UL>::toStream((Bitfield<32UL> *)&subpassDesc,(ostream *)ppvVar10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&imageCreateInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar10);
      std::ios_base::~ios_base(local_190);
      imageCreateInfo._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      ppvVar10 = &imageCreateInfo.pNext;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppvVar10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppvVar10,"SUBPIXEL_BITS = ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)ppvVar10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&imageCreateInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppvVar10);
      std::ios_base::~ios_base(local_190);
      if (descriptorSetLayoutBuilder.m_immutableSamplers.
          super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(descriptorSetLayoutBuilder.m_immutableSamplers.
                        super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)descriptorSetLayoutBuilder.m_immutableSamplers.
                              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)descriptorSetLayoutBuilder.m_immutableSamplers.
                              super__Vector_base<vk::Handle<(vk::HandleType)20>,_std::allocator<vk::Handle<(vk::HandleType)20>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (descriptorSetLayoutBuilder.m_immutableSamplerInfos.
          super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(descriptorSetLayoutBuilder.m_immutableSamplerInfos.
                        super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)descriptorSetLayoutBuilder.m_immutableSamplerInfos.
                              super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)descriptorSetLayoutBuilder.m_immutableSamplerInfos.
                              super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (descriptorSetLayoutBuilder.m_bindings.
          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(descriptorSetLayoutBuilder.m_bindings.
                        super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)descriptorSetLayoutBuilder.m_bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)descriptorSetLayoutBuilder.m_bindings.
                              super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (descriptorPoolBuilder.m_counts.
          super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(descriptorPoolBuilder.m_counts.
                        super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)descriptorPoolBuilder.m_counts.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)descriptorPoolBuilder.m_counts.
                              super__Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    pNVar30 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar30,"Format not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/rasterization/vktRasterizationTests.cpp"
               ,0xf0);
  }
  __cxa_throw(pNVar30,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

BaseRenderingTestInstance::BaseRenderingTestInstance (Context& context, VkSampleCountFlagBits sampleCount, deUint32 renderSize)
	: TestInstance			(context)
	, m_renderSize			(renderSize)
	, m_sampleCount			(sampleCount)
	, m_subpixelBits		(context.getDeviceProperties().limits.subPixelPrecisionBits)
	, m_multisampling		(m_sampleCount != VK_SAMPLE_COUNT_1_BIT)
	, m_imageFormat			(VK_FORMAT_R8G8B8A8_UNORM)
	, m_textureFormat		(vk::mapVkFormat(m_imageFormat))
	, m_uniformBufferSize	(sizeof(float))
	, m_resultBufferSize	(renderSize * renderSize * m_textureFormat.getPixelSize())
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();
	DescriptorPoolBuilder						descriptorPoolBuilder;
	DescriptorSetLayoutBuilder					descriptorSetLayoutBuilder;

	// Command Pool
	m_commandPool = createCommandPool(vkd, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Image
	{
		const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT;
		VkImageFormatProperties	properties;

		if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																					 m_imageFormat,
																					 VK_IMAGE_TYPE_2D,
																					 VK_IMAGE_TILING_OPTIMAL,
																					 imageUsage,
																					 0,
																					 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		if ((properties.sampleCounts & m_sampleCount) != m_sampleCount)
		{
			TCU_THROW(NotSupportedError, "Format not supported");
		}

		const VkImageCreateInfo					imageCreateInfo			=
		{
			VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkImageCreateFlags		flags;
			VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
			m_imageFormat,								// VkFormat					format;
			{ m_renderSize,	m_renderSize, 1u },			// VkExtent3D				extent;
			1u,											// deUint32					mipLevels;
			1u,											// deUint32					arrayLayers;
			m_sampleCount,								// VkSampleCountFlagBits	samples;
			VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
			imageUsage,									// VkImageUsageFlags		usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
			1u,											// deUint32					queueFamilyIndexCount;
			&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
			VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
		};

		m_image = vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);

		m_imageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_image), MemoryRequirement::Any);
		VK_CHECK(vkd.bindImageMemory(vkDevice, *m_image, m_imageMemory->getMemory(), m_imageMemory->getOffset()));
	}

	// Image View
	{
		const VkImageViewCreateInfo				imageViewCreateInfo		=
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
			DE_NULL,									// const void*					pNext;
			0u,											// VkImageViewCreateFlags		flags;
			*m_image,									// VkImage						image;
			VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
			m_imageFormat,								// VkFormat						format;
			makeComponentMappingRGBA(),					// VkComponentMapping			components;
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
				0u,											// deUint32						baseMipLevel;
				1u,											// deUint32						mipLevels;
				0u,											// deUint32						baseArrayLayer;
				1u,											// deUint32						arraySize;
			},											// VkImageSubresourceRange		subresourceRange;
		};

		m_imageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
	}

	if (m_multisampling)
	{
		{
			// Resolved Image
			const VkImageUsageFlags	imageUsage = VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
			VkImageFormatProperties	properties;

			if ((m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(),
																						 m_imageFormat,
																						 VK_IMAGE_TYPE_2D,
																						 VK_IMAGE_TILING_OPTIMAL,
																						 imageUsage,
																						 0,
																						 &properties) == VK_ERROR_FORMAT_NOT_SUPPORTED))
			{
				TCU_THROW(NotSupportedError, "Format not supported");
			}

			const VkImageCreateInfo					imageCreateInfo			=
			{
				VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType			sType;
				DE_NULL,									// const void*				pNext;
				0u,											// VkImageCreateFlags		flags;
				VK_IMAGE_TYPE_2D,							// VkImageType				imageType;
				m_imageFormat,								// VkFormat					format;
				{ m_renderSize,	m_renderSize, 1u },			// VkExtent3D				extent;
				1u,											// deUint32					mipLevels;
				1u,											// deUint32					arrayLayers;
				VK_SAMPLE_COUNT_1_BIT,						// VkSampleCountFlagBits	samples;
				VK_IMAGE_TILING_OPTIMAL,					// VkImageTiling			tiling;
				imageUsage,									// VkImageUsageFlags		usage;
				VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode			sharingMode;
				1u,											// deUint32					queueFamilyIndexCount;
				&queueFamilyIndex,							// const deUint32*			pQueueFamilyIndices;
				VK_IMAGE_LAYOUT_UNDEFINED					// VkImageLayout			initialLayout;
			};

			m_resolvedImage			= vk::createImage(vkd, vkDevice, &imageCreateInfo, DE_NULL);
			m_resolvedImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_resolvedImage), MemoryRequirement::Any);
			VK_CHECK(vkd.bindImageMemory(vkDevice, *m_resolvedImage, m_resolvedImageMemory->getMemory(), m_resolvedImageMemory->getOffset()));
		}

		// Resolved Image View
		{
			const VkImageViewCreateInfo				imageViewCreateInfo		=
			{
				VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,	// VkStructureType				sType;
				DE_NULL,									// const void*					pNext;
				0u,											// VkImageViewCreateFlags		flags;
				*m_resolvedImage,							// VkImage						image;
				VK_IMAGE_VIEW_TYPE_2D,						// VkImageViewType				viewType;
				m_imageFormat,								// VkFormat						format;
				makeComponentMappingRGBA(),					// VkComponentMapping			components;
				{
					VK_IMAGE_ASPECT_COLOR_BIT,					// VkImageAspectFlags			aspectMask;
					0u,											// deUint32						baseMipLevel;
					1u,											// deUint32						mipLevels;
					0u,											// deUint32						baseArrayLayer;
					1u,											// deUint32						arraySize;
				},											// VkImageSubresourceRange		subresourceRange;
			};

			m_resolvedImageView = vk::createImageView(vkd, vkDevice, &imageViewCreateInfo, DE_NULL);
		}

	}

	// Render Pass
	{
		const VkImageLayout						imageLayout				= VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
		const VkAttachmentDescription			attachmentDesc[]		=
		{
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				m_sampleCount,										// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_CLEAR,						// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			},
			{
				0u,													// VkAttachmentDescriptionFlags		flags;
				m_imageFormat,										// VkFormat							format;
				VK_SAMPLE_COUNT_1_BIT,								// VkSampleCountFlagBits			samples;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				loadOp;
				VK_ATTACHMENT_STORE_OP_STORE,						// VkAttachmentStoreOp				storeOp;
				VK_ATTACHMENT_LOAD_OP_DONT_CARE,					// VkAttachmentLoadOp				stencilLoadOp;
				VK_ATTACHMENT_STORE_OP_DONT_CARE,					// VkAttachmentStoreOp				stencilStoreOp;
				imageLayout,										// VkImageLayout					initialLayout;
				imageLayout,										// VkImageLayout					finalLayout;
			}
		};

		const VkAttachmentReference				attachmentRef			=
		{
			0u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkAttachmentReference				resolveAttachmentRef	=
		{
			1u,													// deUint32							attachment;
			imageLayout,										// VkImageLayout					layout;
		};

		const VkSubpassDescription				subpassDesc				=
		{
			0u,													// VkSubpassDescriptionFlags		flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,					// VkPipelineBindPoint				pipelineBindPoint;
			0u,													// deUint32							inputAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pInputAttachments;
			1u,													// deUint32							colorAttachmentCount;
			&attachmentRef,										// const VkAttachmentReference*		pColorAttachments;
			m_multisampling ? &resolveAttachmentRef : DE_NULL,	// const VkAttachmentReference*		pResolveAttachments;
			DE_NULL,											// const VkAttachmentReference*		pDepthStencilAttachment;
			0u,													// deUint32							preserveAttachmentCount;
			DE_NULL,											// const VkAttachmentReference*		pPreserveAttachments;
		};

		const VkRenderPassCreateInfo			renderPassCreateInfo	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,			// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkRenderPassCreateFlags			flags;
			m_multisampling ? 2u : 1u,							// deUint32							attachmentCount;
			attachmentDesc,										// const VkAttachmentDescription*	pAttachments;
			1u,													// deUint32							subpassCount;
			&subpassDesc,										// const VkSubpassDescription*		pSubpasses;
			0u,													// deUint32							dependencyCount;
			DE_NULL,											// const VkSubpassDependency*		pDependencies;
		};

		m_renderPass =  createRenderPass(vkd, vkDevice, &renderPassCreateInfo, DE_NULL);
	}

	// FrameBuffer
	{
		const VkImageView						attachments[]			=
		{
			*m_imageView,
			*m_resolvedImageView
		};

		const VkFramebufferCreateInfo			framebufferCreateInfo	=
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,	// VkStructureType			sType;
			DE_NULL,									// const void*				pNext;
			0u,											// VkFramebufferCreateFlags	flags;
			*m_renderPass,								// VkRenderPass				renderPass;
			m_multisampling ? 2u : 1u,					// deUint32					attachmentCount;
			attachments,								// const VkImageView*		pAttachments;
			m_renderSize,								// deUint32					width;
			m_renderSize,								// deUint32					height;
			1u,											// deUint32					layers;
		};

		m_frameBuffer = createFramebuffer(vkd, vkDevice, &framebufferCreateInfo, DE_NULL);
	}

	// Uniform Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_uniformBufferSize,						// VkDeviceSize			size;
			VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_uniformBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_uniformBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_uniformBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_uniformBuffer, m_uniformBufferMemory->getMemory(), m_uniformBufferMemory->getOffset()));
	}

	// Descriptors
	{
		descriptorPoolBuilder.addType(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER);
		m_descriptorPool = descriptorPoolBuilder.build(vkd, vkDevice, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

		descriptorSetLayoutBuilder.addSingleBinding(VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, VK_SHADER_STAGE_ALL);
		m_descriptorSetLayout = descriptorSetLayoutBuilder.build(vkd, vkDevice);

		const VkDescriptorSetAllocateInfo		descriptorSetParams		=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*m_descriptorPool,
			1u,
			&m_descriptorSetLayout.get(),
		};

		m_descriptorSet = allocateDescriptorSet(vkd, vkDevice, &descriptorSetParams);

		const VkDescriptorBufferInfo			descriptorBufferInfo	=
		{
			*m_uniformBuffer,							// VkBuffer		buffer;
			0u,											// VkDeviceSize	offset;
			VK_WHOLE_SIZE								// VkDeviceSize	range;
		};

		const VkWriteDescriptorSet				writeDescritporSet		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,		// VkStructureType					sType;
			DE_NULL,									// const void*						pNext;
			*m_descriptorSet,							// VkDescriptorSet					destSet;
			0,											// deUint32							destBinding;
			0,											// deUint32							destArrayElement;
			1u,											// deUint32							count;
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,			// VkDescriptorType					descriptorType;
			DE_NULL,									// const VkDescriptorImageInfo*		pImageInfo;
			&descriptorBufferInfo,						// const VkDescriptorBufferInfo*	pBufferInfo;
			DE_NULL										// const VkBufferView*				pTexelBufferView;
		};

		vkd.updateDescriptorSets(vkDevice, 1u, &writeDescritporSet, 0u, DE_NULL);
	}

	// Pipeline Layout
	{
		const VkPipelineLayoutCreateInfo		pipelineLayoutCreateInfo	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType				sType;
			DE_NULL,											// const void*					pNext;
			0u,													// VkPipelineLayoutCreateFlags	flags;
			1u,													// deUint32						descriptorSetCount;
			&m_descriptorSetLayout.get(),						// const VkDescriptorSetLayout*	pSetLayouts;
			0u,													// deUint32						pushConstantRangeCount;
			DE_NULL												// const VkPushConstantRange*	pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vkd, vkDevice, &pipelineLayoutCreateInfo);
	}

	// Shaders
	{
		m_vertexShaderModule	= createShaderModule(vkd, vkDevice, m_context.getBinaryCollection().get("vertext_shader"), 0);
		m_fragmentShaderModule	= createShaderModule(vkd, vkDevice, m_context.getBinaryCollection().get("fragment_shader"), 0);
	}

	// Fence
	m_fence = createFence(vkd, vkDevice);

	// Result Buffer
	{
		const VkBufferCreateInfo				bufferCreateInfo		=
		{
			VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
			DE_NULL,									// const void*			pNext;
			0u,											// VkBufferCreateFlags	flags;
			m_resultBufferSize,							// VkDeviceSize			size;
			VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// VkBufferUsageFlags	usage;
			VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
			1u,											// deUint32				queueFamilyIndexCount;
			&queueFamilyIndex							// const deUint32*		pQueueFamilyIndices;
		};

		m_resultBuffer			= createBuffer(vkd, vkDevice, &bufferCreateInfo);
		m_resultBufferMemory	= allocator.allocate(getBufferMemoryRequirements(vkd, vkDevice, *m_resultBuffer), MemoryRequirement::HostVisible);

		VK_CHECK(vkd.bindBufferMemory(vkDevice, *m_resultBuffer, m_resultBufferMemory->getMemory(), m_resultBufferMemory->getOffset()));
	}

	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Sample count = " << getSampleCountFlagsStr(m_sampleCount) << tcu::TestLog::EndMessage;
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "SUBPIXEL_BITS = " << m_subpixelBits << tcu::TestLog::EndMessage;
}